

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void CVmBifTADS::toIntOrNum(uint argc,int int_only)

{
  int iVar1;
  int32_t iVar2;
  vm_val_t *pvVar3;
  char *pcVar4;
  int in_ESI;
  uint in_EDI;
  bool bVar5;
  vm_val_t val;
  size_t len2;
  char *p2;
  int in_stack_00000028;
  int radix;
  size_t len;
  char *strp;
  long intval;
  vm_val_t *valp;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  uint in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  size_t local_40;
  int *local_38;
  
  CVmBif::check_argc_range
            (in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
             CONCAT13(in_stack_ffffffffffffffaf,
                      CONCAT12(in_stack_ffffffffffffffae,in_stack_ffffffffffffffac)));
  pvVar3 = CVmStack::get(0);
  if ((pvVar3->typ == VM_OBJ) && (iVar1 = CVmObjBigNum::is_bignum_obj(0), iVar1 != 0)) {
    if (in_ESI == 0) {
      CVmBif::retval((vm_val_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
    else {
      vm_objp(0);
      CVmObjBigNum::convert_to_int
                ((CVmObjBigNum *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      CVmBif::retval_int(0x2a4616);
    }
    CVmStack::discard(in_EDI);
  }
  else if (pvVar3->typ == VM_INT) {
    CVmBif::retval_int(0x2a4648);
    CVmStack::discard(in_EDI);
  }
  else if ((pvVar3->typ == VM_TRUE) || (pvVar3->typ == VM_NIL)) {
    CVmBif::retval_int(0x2a4686);
    CVmStack::discard(in_EDI);
  }
  else {
    CVmStack::get(0);
    pcVar4 = vm_val_t::get_as_string
                       ((vm_val_t *)
                        CONCAT17(in_stack_ffffffffffffffaf,
                                 CONCAT16(in_stack_ffffffffffffffae,
                                          CONCAT24(in_stack_ffffffffffffffac,
                                                   in_stack_ffffffffffffffa8))));
    if (pcVar4 == (char *)0x0) {
      err_throw(0);
    }
    local_40 = vmb_get_len((char *)0x2a46c6);
    local_38 = (int *)(pcVar4 + 2);
    if (1 < in_EDI) {
      CVmStack::get(1);
      iVar2 = vm_val_t::num_to_int
                        ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      if ((iVar2 < 2) || (0x24 < iVar2)) {
        err_throw(0);
      }
    }
    while( true ) {
      bVar5 = false;
      if (local_40 != 0) {
        iVar1 = is_space(L'\0');
        bVar5 = iVar1 != 0;
      }
      if (!bVar5) break;
      local_38 = (int *)((long)local_38 + 1);
      local_40 = local_40 - 1;
    }
    while( true ) {
      bVar5 = false;
      if (local_40 != 0) {
        iVar1 = is_space(L'\0');
        bVar5 = iVar1 != 0;
      }
      if (!bVar5) break;
      local_40 = local_40 - 1;
    }
    if ((local_40 == 3) && (iVar1 = memcmp(local_38,"nil",3), iVar1 == 0)) {
      CVmBif::retval_int(0x2a47f1);
    }
    else if ((local_40 == 4) && (*local_38 == 0x65757274)) {
      CVmBif::retval_int(0x2a481c);
    }
    else {
      CVmObjString::parse_num_val((vm_val_t *)intval,strp,len,radix,in_stack_00000028);
      CVmBif::retval((vm_val_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
    CVmStack::discard(in_EDI);
  }
  return;
}

Assistant:

void CVmBifTADS::toIntOrNum(VMG_ uint argc, int int_only)
{    
    /* check arguments */
    check_argc_range(vmg_ argc, 1, 2);

    /* check for BigNumber values */
    vm_val_t *valp = G_stk->get(0);
    if (valp->typ == VM_OBJ
        && CVmObjBigNum::is_bignum_obj(vmg_ valp->val.obj))
    {
        /*
         *   If we only want integer results, try converting the BigNumber to
         *   an integer.  Otherwise, simply return the BigNumber as-is. 
         */
        if (int_only)
        {
            /* we only want an integer result - convert to int */
            long intval = ((CVmObjBigNum *)vm_objp(vmg_ valp->val.obj))
                          ->convert_to_int();

            /* return the integer value */
            retval_int(vmg_ intval);
        }
        else
        {
            /* BigNumber results are okay - just return the BigNumber */
            retval(vmg_ valp);
        }
        
        /* discard arguments, and we're done */
        G_stk->discard(argc);
        return;
    }

    /* if it's already an integer, just return the same value */
    if (valp->typ == VM_INT)
    {
        /* just return the argument value */
        retval_int(vmg_ valp->val.intval);

        /* discard arguments and return */
        G_stk->discard(argc);
        return;
    }

    /* if it's true or nil, convert to 1 or 0 */
    if (valp->typ == VM_TRUE || valp->typ == VM_NIL)
    {
        /* return 1 for true, 0 for nil */
        retval_int(vmg_ valp->typ == VM_TRUE ? 1 : 0);
        G_stk->discard(argc);
        return;
    }

    /* the only other type of value we can convert is a string */
    const char *strp = G_stk->get(0)->get_as_string(vmg0_);
    if (strp == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get the string length and buffer pointer */
    size_t len = vmb_get_len(strp);
    strp += VMB_LEN;

    /* if there's a radix specified, pop it as well; the default is 10 */
    int radix = 10;
    if (argc >= 2)
    {
        /* get the radix from the stack */
        radix = G_stk->get(1)->num_to_int(vmg0_);

        /* make sure it's in the valid range */
        if (radix < 2 || radix > 36)
            err_throw(VMERR_BAD_VAL_BIF);
    }

    /* get a version of the string stripped of leading and trailing spaces */
    const char *p2 = strp;
    size_t len2 = len;
    for ( ; len2 != 0 && is_space(*p2) ; ++p2, --len2) ;
    for ( ; len2 != 0 && is_space(*(p2 + len2 - 1)) ; --len2) ;

    /* 
     *   Check for "nil" and "true", ignoring leading and trailing spaces; if
     *   it matches either of those, return the corresponding boolean value.
     *   Otherwise, parse the string as an integer value in the given radix.
     */
    if (len2 == 3 && memcmp(p2, "nil", 3) == 0)
    {
        /* the value for "nil" is 0 */
        retval_int(vmg_ 0);
    }
    else if (len2 == 4 && memcmp(p2, "true", 4) == 0)
    {
        /* the value for "true" is 1 */
        retval_int(vmg_ 1);
    }
    else
    {
        /* parse the string as an integer (orBigNumber if it's too large) */
        vm_val_t val;
        CVmObjString::parse_num_val(vmg_ &val, strp, len, radix, int_only);
        retval(vmg_ &val);
    }

    /* discard arguments */
    G_stk->discard(argc);
}